

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

string * __thiscall sf::String::toAnsiString_abi_cxx11_(String *this,locale *locale)

{
  __normal_iterator<const_unsigned_int_*,_std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
  begin;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> *in_RSI;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> *in_RDI;
  string *output;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_ffffffffffffff88;
  char replacement;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  output_00;
  __normal_iterator<const_unsigned_int_*,_std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffffb0;
  
  output_00.container = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::length
            (in_RSI);
  replacement = (char)((ulong)in_RSI >> 0x38);
  std::__cxx11::string::reserve((ulong)output_00.container);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::begin
            (in_stack_ffffffffffffff88);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::end
            (in_RDI);
  begin._M_current =
       (uint *)std::back_inserter<std::__cxx11::string>
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffffff88);
  Utf<32u>::
  toAnsi<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::__cxx11::basic_string<unsigned_int,std::char_traits<unsigned_int>,std::allocator<unsigned_int>>>,std::back_insert_iterator<std::__cxx11::string>>
            (begin,in_stack_ffffffffffffffb0,output_00,replacement,(locale *)in_RDI);
  return (string *)in_RDI;
}

Assistant:

std::string String::toAnsiString(const std::locale& locale) const
{
    // Prepare the output string
    std::string output;
    output.reserve(m_string.length() + 1);

    // Convert
    Utf32::toAnsi(m_string.begin(), m_string.end(), std::back_inserter(output), 0, locale);

    return output;
}